

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O3

uint8_t FACT_INTERNAL_CreateSound(FACTCue *cue,uint16_t fadeInMS)

{
  FACTAudioCategory *pFVar1;
  FACTInstanceRPCData *pFVar2;
  byte *pbVar3;
  byte bVar4;
  ushort uVar5;
  FACTAudioEngine *pFVar6;
  char *pcVar7;
  FACTSound *pFVar8;
  byte bVar9;
  uint32_t uVar10;
  uint uVar11;
  int iVar12;
  FACTSoundBank *pFVar13;
  FACTSoundInstance *pFVar14;
  FACTTrackInstance *pFVar15;
  FACTEventInstance *pFVar16;
  ulong uVar17;
  FACTVariation *pFVar18;
  uint16_t uVar19;
  ulong uVar20;
  uint32_t *puVar21;
  FACTTrack *pFVar22;
  ulong uVar23;
  FACTCue *pFVar24;
  ushort *puVar25;
  float *pfVar26;
  long lVar27;
  FACTCue *pCue;
  FACTVariationTable *pFVar28;
  LinkedList *pLVar29;
  FACTSound *pFVar30;
  ulong uVar31;
  ulong uVar32;
  FACTEvent *pFVar33;
  FACTWaveBank *pWaveBank;
  float fVar34;
  float next;
  float local_4c;
  FACTCue *local_48;
  float local_3c;
  ulong local_38;
  
  pFVar30 = (FACTSound *)(cue->field_7).variation;
  if ((cue->data->flags & 4) == 0) {
    if (pFVar30->flags == '\x03') {
      pFVar6 = cue->parentBank->parentEngine;
      uVar19 = pFVar30->category;
      if ((pFVar6->variables[(short)uVar19].accessibility & 4) == 0) {
        FACTAudioEngine_GetGlobalVariable(pFVar6,uVar19,&local_4c);
      }
      else {
        FACTCue_GetVariable(cue,uVar19,&local_4c);
      }
      pFVar28 = (cue->field_7).variation;
      uVar5 = pFVar28->entryCount;
      if (uVar5 == 0) {
        uVar20 = 0;
      }
      else {
        pfVar26 = &pFVar28->entries->maxWeight;
        uVar20 = 0;
        while ((*pfVar26 < local_4c || (local_4c < pfVar26[-1]))) {
          uVar20 = uVar20 + 1;
          pfVar26 = pfVar26 + 4;
          if ((uint)uVar5 == uVar20) {
            return '\x01';
          }
        }
      }
      uVar11 = (uint)uVar20;
      if (uVar11 == uVar5) {
        return '\x01';
      }
    }
    else {
      uVar5 = *(ushort *)((long)&pFVar30->volume + 2);
      if (uVar5 == 0) {
        fVar34 = 0.0;
      }
      else {
        fVar34 = 0.0;
        lVar27 = 0;
        do {
          fVar34 = fVar34 + (*(float *)(*(long *)&pFVar30->pitch + 8 + lVar27) -
                            *(float *)(*(long *)&pFVar30->pitch + 4 + lVar27));
          lVar27 = lVar27 + 0x10;
        } while ((ulong)uVar5 * 0x10 != lVar27);
      }
      local_48 = (FACTCue *)CONCAT44(local_48._4_4_,fVar34);
      uVar11 = stb_rand();
      local_4c = (float)((double)uVar11 * 2.3283064365386963e-10) * local_48._0_4_;
      pFVar28 = (cue->field_7).variation;
      uVar5 = pFVar28->entryCount;
      uVar20 = (ulong)uVar5;
      uVar11 = -(uint)(uVar5 == 0);
      lVar27 = (ulong)uVar5 * 0x10 + -8;
      fVar34 = local_48._0_4_;
      do {
        if ((long)uVar20 < 2) goto LAB_0010de09;
        uVar20 = uVar20 - 1;
        fVar34 = fVar34 - (*(float *)((long)&pFVar28->entries->field_0 + lVar27) -
                          *(float *)((long)pFVar28->entries + lVar27 + -4));
        lVar27 = lVar27 + -0x10;
      } while (local_4c <= fVar34);
      uVar11 = (uint)uVar20;
    }
LAB_0010de09:
    pFVar13 = cue->parentBank;
    if (pFVar28->isComplex == '\0') {
      pFVar18 = pFVar28->entries;
      pLVar29 = pFVar13->parentEngine->wbList;
      if (pLVar29 == (LinkedList *)0x0) {
        pWaveBank = (FACTWaveBank *)0x0;
      }
      else {
        pcVar7 = pFVar13->wavebankNames[pFVar18[(int)uVar11].field_0.simple.wavebank];
        do {
          pWaveBank = (FACTWaveBank *)pLVar29->entry;
          iVar12 = SDL_strcmp(pcVar7,pWaveBank->name);
          if (iVar12 == 0) break;
          pLVar29 = pLVar29->next;
        } while (pLVar29 != (LinkedList *)0x0);
        pFVar18 = ((cue->field_7).variation)->entries;
      }
      FACTWaveBank_Prepare
                (pWaveBank,pFVar18[(int)uVar11].field_0.simple.track,0,0,'\0',&cue->simpleWave);
      cue->simpleWave->parentCue = cue;
      return '\x01';
    }
    if (pFVar13->soundCount == 0) {
      return '\x01';
    }
    puVar21 = pFVar13->soundCodes;
    lVar27 = 0;
    while (pFVar28->entries[(int)uVar11].field_0.soundCode != *puVar21) {
      lVar27 = lVar27 + -0x28;
      puVar21 = puVar21 + 1;
      if ((ulong)pFVar13->soundCount * 0x28 + lVar27 == 0) {
        return '\x01';
      }
    }
    pFVar30 = (FACTSound *)((long)pFVar13->sounds - lVar27);
  }
  if (pFVar30 == (FACTSound *)0x0) {
    return '\x01';
  }
  uVar5 = pFVar30->category;
  pFVar13 = cue->parentBank;
  if ((ulong)uVar5 == 0xffff) goto LAB_0010def5;
  pFVar1 = pFVar13->parentEngine->categories + uVar5;
  if ((pFVar1->instanceLimit <= pFVar1->instanceCount) && (pFVar1->maxInstanceBehavior < 5)) {
    pFVar24 = pFVar13->cueList;
    switch(pFVar1->maxInstanceBehavior) {
    case '\0':
      cue->state = cue->state & 0xffffff87 | 0x20;
      return '\0';
    case '\x01':
      for (; pFVar24 != (FACTCue *)0x0; pFVar24 = pFVar24->next) {
        if (((pFVar24 != cue) &&
            (pFVar14 = pFVar24->playingSound, pFVar14 != (FACTSoundInstance *)0x0)) &&
           ((pFVar14->sound->category == uVar5 && ((pFVar24->state & 0x30) == 0))))
        goto LAB_0010e47f;
      }
      break;
    case '\x02':
      for (; pFVar24 != (FACTCue *)0x0; pFVar24 = pFVar24->next) {
        if ((((pFVar24 != cue) &&
             (pFVar14 = pFVar24->playingSound, pFVar14 != (FACTSoundInstance *)0x0)) &&
            (pFVar14->sound->category == uVar5)) && ((pFVar24->state & 0x30) == 0))
        goto LAB_0010e47f;
      }
      break;
    case '\x03':
      if (pFVar24 != (FACTCue *)0x0) {
        pCue = (FACTCue *)0x0;
        do {
          if (((pFVar24 != cue) && (pFVar24->playingSound != (FACTSoundInstance *)0x0)) &&
             ((pFVar24->playingSound->sound->category == uVar5 && ((pFVar24->state & 0x30) == 0))))
          {
            pCue = pFVar24;
          }
          pFVar24 = pFVar24->next;
        } while (pFVar24 != (FACTCue *)0x0);
LAB_0010e45c:
        if (pCue != (FACTCue *)0x0) {
          pFVar14 = pCue->playingSound;
          fadeInMS = pFVar1->fadeInMS;
          if (pFVar14 != (FACTSoundInstance *)0x0) goto LAB_0010e484;
          FACTCue_Stop(pCue,0);
        }
      }
      break;
    case '\x04':
      if (pFVar24 != (FACTCue *)0x0) {
        bVar9 = 0xff;
        pCue = (FACTCue *)0x0;
        do {
          if ((((pFVar24 != cue) && (pFVar24->playingSound != (FACTSoundInstance *)0x0)) &&
              (pFVar8 = pFVar24->playingSound->sound, pFVar8->category == uVar5)) &&
             ((bVar4 = pFVar8->priority, bVar4 < bVar9 && ((pFVar24->state & 0x30) == 0)))) {
            pCue = pFVar24;
            bVar9 = bVar4;
          }
          pFVar24 = pFVar24->next;
        } while (pFVar24 != (FACTCue *)0x0);
        goto LAB_0010e45c;
      }
    }
  }
LAB_0010deed:
  pFVar1->instanceCount = pFVar1->instanceCount + '\x01';
  pFVar13 = cue->parentBank;
LAB_0010def5:
  pFVar14 = (FACTSoundInstance *)(*pFVar13->parentEngine->pMalloc)(0x38);
  pFVar14->parentCue = cue;
  pFVar14->sound = pFVar30;
  (pFVar14->rpcData).rpcFilterQFactor = 1.0;
  (pFVar14->rpcData).rpcVolume = 0.0;
  (pFVar14->rpcData).rpcPitch = 0.0;
  (pFVar14->rpcData).rpcReverbSend = 0.0;
  (pFVar14->rpcData).rpcFilterFreq = 1.0;
  pFVar14->fadeType = fadeInMS != 0;
  if (fadeInMS == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = FAudio_timems();
    pFVar30 = pFVar14->sound;
  }
  pFVar14->fadeStart = uVar10;
  pFVar14->fadeTarget = fadeInMS;
  pFVar15 = (FACTTrackInstance *)
            (*cue->parentBank->parentEngine->pMalloc)((ulong)pFVar30->trackCount * 0x68);
  pFVar14->tracks = pFVar15;
  pFVar30 = pFVar14->sound;
  local_48 = cue;
  if (pFVar30->trackCount == '\0') {
    cue->maxRpcReleaseTime = 0;
  }
  else {
    uVar20 = 0;
    do {
      pFVar15 = pFVar14->tracks;
      pFVar2 = &pFVar15[uVar20].rpcData;
      pFVar2->rpcVolume = 0.0;
      pFVar2->rpcPitch = 0.0;
      pFVar2->rpcReverbSend = 0.0;
      pFVar2->rpcFilterFreq = 1.0;
      pFVar15[uVar20].evtVolume = 0.0;
      *(undefined8 *)&pFVar15[uVar20].rpcData.rpcFilterQFactor = 0x3f800000;
      pFVar15[uVar20].activeWave.wave = (FACTWave *)0x0;
      pFVar15[uVar20].activeWave.baseVolume = 0.0;
      pFVar15[uVar20].activeWave.basePitch = 0;
      pFVar15[uVar20].activeWave.baseQFactor = 1.0;
      pFVar15[uVar20].activeWave.baseFrequency = 1.0;
      pFVar15[uVar20].upcomingWave.wave = (FACTWave *)0x0;
      pFVar15[uVar20].upcomingWave.baseVolume = 0.0;
      pFVar15[uVar20].upcomingWave.basePitch = 0;
      pFVar15[uVar20].upcomingWave.baseQFactor = 1.0;
      pFVar15[uVar20].upcomingWave.baseFrequency = 1.0;
      local_38 = uVar20;
      pFVar16 = (FACTEventInstance *)
                (*local_48->parentBank->parentEngine->pMalloc)
                          ((ulong)pFVar30->tracks[uVar20].eventCount * 0xc);
      uVar32 = local_38;
      pFVar14->tracks[uVar20].events = pFVar16;
      pFVar30 = pFVar14->sound;
      pFVar22 = pFVar30->tracks;
      if (pFVar22[uVar20].eventCount != '\0') {
        uVar31 = 0;
        do {
          pFVar33 = pFVar22[uVar32].events;
          pFVar16 = pFVar14->tracks[uVar20].events;
          pFVar16[uVar31].timestamp = (uint)pFVar33[uVar31].timestamp;
          pFVar16[uVar31].loopCount = 0;
          pFVar16[uVar31].finished = '\0';
          pFVar16[uVar31].field_3.value = 0.0;
          uVar5 = pFVar33[uVar31].type;
          if (uVar5 < 0x13) {
            if ((0x5aU >> (uVar5 & 0x1f) & 1) == 0) {
              if ((0x30000U >> (uVar5 & 0x1f) & 1) == 0) {
                if (uVar5 != 0x12) goto LAB_0010e1c0;
                pFVar15 = pFVar14->tracks;
                uVar19 = pFVar14->sound->tracks[uVar32].events[uVar31].field_3.wave.angle;
              }
              else {
                pFVar15 = pFVar14->tracks;
                uVar19 = pFVar14->sound->tracks[uVar32].events[uVar31].field_3.wave.position;
              }
              pFVar15[uVar20].events[uVar31].loopCount = uVar19;
            }
            else {
              pFVar33 = pFVar33 + uVar31;
              pFVar16 = pFVar14->tracks[uVar20].events + uVar31;
              pFVar16->loopCount =
                   (ushort)pFVar14->sound->tracks[uVar32].events[uVar31].field_3.wave.loopCount;
              uVar17 = 0;
              if (((pFVar33->field_3).wave.isComplex != '\0') &&
                 ((undefined1  [72])((undefined1  [72])pFVar33->field_3 & (undefined1  [72])0xf) !=
                  (undefined1  [72])0x0)) {
                uVar17 = (ulong)*(ushort *)((long)&pFVar33->field_3 + 10);
                if (uVar17 == 0) {
                  local_3c = 0.0;
                }
                else {
                  local_3c = 0.0;
                  uVar23 = 0;
                  do {
                    local_3c = local_3c +
                               (float)*(byte *)(*(long *)((long)&pFVar33->field_3 + 0x20) + uVar23);
                    uVar23 = uVar23 + 1;
                  } while (uVar17 != uVar23);
                }
                uVar11 = stb_rand();
                local_4c = (float)((double)uVar11 * 2.3283064365386963e-10) * local_3c;
                uVar17 = (ulong)*(ushort *)((long)&pFVar33->field_3 + 10);
                fVar34 = local_3c;
                do {
                  if ((long)uVar17 < 1) goto LAB_0010e18c;
                  pbVar3 = (byte *)(*(long *)((long)&pFVar33->field_3 + 0x20) + -1 + uVar17);
                  uVar17 = uVar17 - 1;
                  fVar34 = fVar34 - (float)*pbVar3;
                } while (local_4c <= fVar34);
              }
              (pFVar16->field_3).valuei = (uint32_t)uVar17;
LAB_0010e18c:
              FACT_INTERNAL_GetNextWave
                        (local_48,pFVar14->sound,pFVar14->sound->tracks + uVar32,
                         pFVar14->tracks + uVar20,pFVar33,pFVar16);
              pFVar15 = pFVar14->tracks;
              pFVar15[uVar20].waveEvt = pFVar33;
              pFVar15[uVar20].waveEvtInst = pFVar16;
            }
          }
LAB_0010e1c0:
          uVar31 = uVar31 + 1;
          pFVar30 = pFVar14->sound;
          pFVar22 = pFVar30->tracks;
        } while (uVar31 < pFVar22[uVar32].eventCount);
      }
      uVar20 = local_38 + 1;
      bVar9 = pFVar30->trackCount;
    } while (uVar20 < bVar9);
    local_48->maxRpcReleaseTime = 0;
    if (bVar9 != 0) {
      uVar20 = 0;
      do {
        pFVar22 = pFVar30->tracks;
        if (pFVar22[uVar20].rpcCodeCount != '\0') {
          uVar32 = 0;
          do {
            pFVar6 = pFVar14->parentCue->parentBank->parentEngine;
            if (pFVar6->rpcCount != 0) {
              puVar21 = pFVar6->rpcCodes;
              lVar27 = 0;
              do {
                if (*puVar21 == pFVar22[uVar20].rpcCodes[uVar32]) {
                  puVar25 = (ushort *)((long)pFVar6->rpcs - lVar27);
                  goto LAB_0010e266;
                }
                lVar27 = lVar27 + -0x10;
                puVar21 = puVar21 + 1;
              } while ((ulong)pFVar6->rpcCount * 0x10 + lVar27 != 0);
            }
            puVar25 = (ushort *)0x0;
LAB_0010e266:
            if ((((puVar25[2] == 0) &&
                 ((local_48->parentBank->parentEngine->variables[*puVar25].accessibility & 4) != 0))
                && (iVar12 = SDL_strcmp(pFVar6->variableNames[*puVar25],"ReleaseTime"), iVar12 == 0)
                ) && (fVar34 = *(float *)(*(long *)(puVar25 + 4) + -0xc +
                                         (ulong)(byte)puVar25[1] * 0xc),
                     (float)local_48->maxRpcReleaseTime < fVar34)) {
              local_48->maxRpcReleaseTime = (uint32_t)(long)fVar34;
            }
            uVar32 = uVar32 + 1;
            pFVar30 = pFVar14->sound;
            pFVar22 = pFVar30->tracks;
          } while (uVar32 < pFVar22[uVar20].rpcCodeCount);
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < pFVar30->trackCount);
    }
  }
  local_48->playingSound = pFVar14;
  return '\x01';
LAB_0010e47f:
  fadeInMS = pFVar1->fadeInMS;
LAB_0010e484:
  FACT_INTERNAL_BeginFadeOut(pFVar14,pFVar1->fadeOutMS);
  goto LAB_0010deed;
}

Assistant:

uint8_t FACT_INTERNAL_CreateSound(FACTCue *cue, uint16_t fadeInMS)
{
	int32_t i, j, k;
	float max, next, weight;
	const char *wbName;
	FACTWaveBank *wb = NULL;
	LinkedList *list;
	FACTEvent *evt;
	FACTEventInstance *evtInst;
	FACTSound *baseSound = NULL;
	FACTSoundInstance *newSound;
	FACTRPC *rpc;
	float lastX;

	union
	{
		float maxf;
		uint8_t maxi;
	} limitmax;
	FACTCue *tmp, *wnr;
	uint16_t categoryIndex;
	FACTAudioCategory *category;

	if (cue->data->flags & 0x04)
	{
		/* Sound */
		baseSound = cue->sound;
	}
	else
	{
		/* Variation */
		if (cue->variation->flags == 3)
		{
			/* Interactive */
			if (cue->parentBank->parentEngine->variables[cue->variation->variable].accessibility & 0x04)
			{
				FACTCue_GetVariable(
					cue,
					cue->variation->variable,
					&next
				);
			}
			else
			{
				FACTAudioEngine_GetGlobalVariable(
					cue->parentBank->parentEngine,
					cue->variation->variable,
					&next
				);
			}
			for (i = 0; i < cue->variation->entryCount; i += 1)
			{
				if (	next <= cue->variation->entries[i].maxWeight &&
					next >= cue->variation->entries[i].minWeight	)
				{
					break;
				}
			}

			/* This should only happen when the user control
			 * variable is none of the sound probabilities, in
			 * which case we are just silent. But, we should still
			 * claim to be "playing" in the meantime.
			 */
			if (i == cue->variation->entryCount)
			{
				return 1;
			}
		}
		else
		{
			/* Random */
			max = 0.0f;
			for (i = 0; i < cue->variation->entryCount; i += 1)
			{
				max += (
					cue->variation->entries[i].maxWeight -
					cue->variation->entries[i].minWeight
				);
			}
			next = FACT_INTERNAL_rng() * max;

			/* Use > 0, not >= 0. If we hit 0, that's it! */
			for (i = cue->variation->entryCount - 1; i > 0; i -= 1)
			{
				weight = (
					cue->variation->entries[i].maxWeight -
					cue->variation->entries[i].minWeight
				);
				if (next > (max - weight))
				{
					break;
				}
				max -= weight;
			}
		}

		if (cue->variation->isComplex)
		{
			/* Grab the Sound via the code. FIXME: Do this at load time? */
			for (j = 0; j < cue->parentBank->soundCount; j += 1)
			{
				if (cue->variation->entries[i].soundCode == cue->parentBank->soundCodes[j])
				{
					baseSound = &cue->parentBank->sounds[j];
					break;
				}
			}
		}
		else
		{
			/* Pull in the WaveBank... */
			wbName = cue->parentBank->wavebankNames[
				cue->variation->entries[i].simple.wavebank
			];
			list = cue->parentBank->parentEngine->wbList;
			while (list != NULL)
			{
				wb = (FACTWaveBank*) list->entry;
				if (FAudio_strcmp(wbName, wb->name) == 0)
				{
					break;
				}
				list = list->next;
			}
			FAudio_assert(wb != NULL);

			/* Generate the wave... */
			FACTWaveBank_Prepare(
				wb,
				cue->variation->entries[i].simple.track,
				0,
				0,
				0,
				&cue->simpleWave
			);
			cue->simpleWave->parentCue = cue;
		}
	}

	/* Alloc SoundInstance variables */
	if (baseSound != NULL)
	{
		/* Category Instance Limits */
		categoryIndex = baseSound->category;
		if (categoryIndex != FACTCATEGORY_INVALID)
		{
			category = &cue->parentBank->parentEngine->categories[categoryIndex];
			if (category->instanceCount >= category->instanceLimit)
			{
				wnr = NULL;
				tmp = cue->parentBank->cueList;
				if (category->maxInstanceBehavior == 0) /* Fail */
				{
					cue->state |= FACT_STATE_STOPPED;
					cue->state &= ~(
						FACT_STATE_PLAYING |
						FACT_STATE_STOPPING |
						FACT_STATE_PAUSED
					);
					return 0;
				}
				else if (category->maxInstanceBehavior == 1) /* Queue */
				{
					/* FIXME: How is this different from Replace Oldest? */
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							break;
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 2) /* Replace Oldest */
				{
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							break;
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 3) /* Replace Quietest */
				{
					limitmax.maxf = FACTVOLUME_MAX;
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							/*FIXME: tmp->playingSound->volume < limitmax.maxf &&*/
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							/* limitmax.maxf = tmp->playingSound->volume; */
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 4) /* Replace Lowest Priority */
				{
					limitmax.maxi = 0xFF;
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							tmp->playingSound->sound->priority < limitmax.maxi &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							limitmax.maxi = tmp->playingSound->sound->priority;
						}
						tmp = tmp->next;
					}
				}
				if (wnr != NULL)
				{
					fadeInMS = category->fadeInMS;
					if (wnr->playingSound != NULL)
					{
						FACT_INTERNAL_BeginFadeOut(wnr->playingSound, category->fadeOutMS);
					}
					else
					{
						FACTCue_Stop(wnr, 0);
					}
				}
			}
			category->instanceCount += 1;
		}

		newSound = (FACTSoundInstance*) cue->parentBank->parentEngine->pMalloc(
			sizeof(FACTSoundInstance)
		);
		newSound->parentCue = cue;
		newSound->sound = baseSound;
		newSound->rpcData.rpcVolume = 0.0f;
		newSound->rpcData.rpcPitch = 0.0f;
		newSound->rpcData.rpcReverbSend = 0.0f;
		newSound->rpcData.rpcFilterQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
		newSound->rpcData.rpcFilterFreq = FAUDIO_DEFAULT_FILTER_FREQUENCY;
		newSound->fadeType = (fadeInMS > 0);
		if (newSound->fadeType)
		{
			newSound->fadeStart = FAudio_timems();
			newSound->fadeTarget = fadeInMS;
		}
		else
		{
			newSound->fadeStart = 0;
			newSound->fadeTarget = 0;
		}
		newSound->tracks = (FACTTrackInstance*) cue->parentBank->parentEngine->pMalloc(
			sizeof(FACTTrackInstance) * newSound->sound->trackCount
		);
		for (i = 0; i < newSound->sound->trackCount; i += 1)
		{
			newSound->tracks[i].rpcData.rpcVolume = 0.0f;
			newSound->tracks[i].rpcData.rpcPitch = 0.0f;
			newSound->tracks[i].rpcData.rpcReverbSend = 0.0f;
			newSound->tracks[i].rpcData.rpcFilterQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].rpcData.rpcFilterFreq = FAUDIO_DEFAULT_FILTER_FREQUENCY;

			newSound->tracks[i].evtVolume = 0.0f;
			newSound->tracks[i].evtPitch = 0.0f;

			newSound->tracks[i].activeWave.wave = NULL;
			newSound->tracks[i].activeWave.baseVolume = 0.0f;
			newSound->tracks[i].activeWave.basePitch = 0;
			newSound->tracks[i].activeWave.baseQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].activeWave.baseFrequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
			newSound->tracks[i].upcomingWave.wave = NULL;
			newSound->tracks[i].upcomingWave.baseVolume = 0.0f;
			newSound->tracks[i].upcomingWave.basePitch = 0;
			newSound->tracks[i].upcomingWave.baseQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].upcomingWave.baseFrequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;

			newSound->tracks[i].events = (FACTEventInstance*) cue->parentBank->parentEngine->pMalloc(
				sizeof(FACTEventInstance) * newSound->sound->tracks[i].eventCount
			);
			for (j = 0; j < newSound->sound->tracks[i].eventCount; j += 1)
			{
				evt = &newSound->sound->tracks[i].events[j];

				newSound->tracks[i].events[j].timestamp =
					newSound->sound->tracks[i].events[j].timestamp;
				newSound->tracks[i].events[j].loopCount = 0;
				newSound->tracks[i].events[j].finished = 0;
				newSound->tracks[i].events[j].value = 0.0f;

				if (	evt->type == FACTEVENT_PLAYWAVE ||
					evt->type == FACTEVENT_PLAYWAVETRACKVARIATION ||
					evt->type == FACTEVENT_PLAYWAVEEFFECTVARIATION ||
					evt->type == FACTEVENT_PLAYWAVETRACKEFFECTVARIATION	)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].wave.loopCount;

					evtInst = &newSound->tracks[i].events[j];
					if (	!evt->wave.isComplex ||
						(evt->wave.complex.variation & 0xF) == 0	)
					{
						evtInst->valuei = 0;
					}
					else
					{
						max = 0.0f;
						for (k = 0; k < evt->wave.complex.trackCount; k += 1)
						{
							max += evt->wave.complex.weights[k];
						}
						next = FACT_INTERNAL_rng() * max;
						for (k = evt->wave.complex.trackCount - 1; k >= 0; k -= 1)
						{
							if (next > (max - evt->wave.complex.weights[k]))
							{
								evtInst->valuei = k;
								break;
							}
							max -= evt->wave.complex.weights[k];
						}
					}
					FACT_INTERNAL_GetNextWave(
						cue,
						newSound->sound,
						&newSound->sound->tracks[i],
						&newSound->tracks[i],
						evt,
						evtInst
					);
					newSound->tracks[i].waveEvt = evt;
					newSound->tracks[i].waveEvtInst = evtInst;
				}
				else if (	evt->type == FACTEVENT_PITCHREPEATING ||
						evt->type == FACTEVENT_VOLUMEREPEATING	)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].value.repeats;
				}
				else if (evt->type == FACTEVENT_MARKERREPEATING)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].marker.repeats;
				}
			}
		}

		/* Calculate Max RPC Release Time */
		cue->maxRpcReleaseTime = 0;
		for (i = 0; i < newSound->sound->trackCount; i += 1)
		{
			for (j = 0; j < newSound->sound->tracks[i].rpcCodeCount; j += 1)
			{
				rpc = FACT_INTERNAL_GetRPC(
					newSound->parentCue->parentBank->parentEngine,
					newSound->sound->tracks[i].rpcCodes[j]
				);
				if (	rpc->parameter == RPC_PARAMETER_VOLUME &&
					cue->parentBank->parentEngine->variables[rpc->variable].accessibility & 0x04	)
				{
					if (FAudio_strcmp(
						newSound->parentCue->parentBank->parentEngine->variableNames[rpc->variable],
						"ReleaseTime"
					) == 0) {
						lastX = rpc->points[rpc->pointCount - 1].x;
						if (lastX > cue->maxRpcReleaseTime)
						{
							cue->maxRpcReleaseTime = (uint32_t) lastX /* bleh */;
						}
					}
				}
			}
		}

		cue->playingSound = newSound;
	}

	return 1;
}